

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

void tcu::astc::anon_unknown_0::decodeISE
               (ISEDecodedResult *dst,int numValues,BitAccessStream *data,ISEParams *params)

{
  int iVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  uint uVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  deUint32 *pdVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  deUint32 local_68 [4];
  deUint32 local_58;
  ulong local_50;
  ulong local_48;
  ISEParams *local_40;
  uint local_34;
  
  local_40 = params;
  if (params->mode == ISEMODE_TRIT) {
    uVar4 = (numValues / 5 + 1) - (uint)(numValues % 5 == 0);
    local_50 = (ulong)(uVar4 - 1);
    local_34 = (uVar4 - 1) * -5 + numValues;
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    local_48 = (ulong)uVar4;
    for (uVar13 = 0; uVar13 != local_48; uVar13 = uVar13 + 1) {
      uVar4 = 5;
      if (uVar13 == local_50) {
        uVar4 = local_34;
      }
      iVar1 = local_40->numBits;
      local_68[0] = BitAccessStream::getNext(data,iVar1);
      dVar5 = BitAccessStream::getNext(data,2);
      local_68[1] = BitAccessStream::getNext(data,iVar1);
      dVar6 = BitAccessStream::getNext(data,2);
      local_68[2] = BitAccessStream::getNext(data,iVar1);
      dVar7 = BitAccessStream::getNext(data,1);
      local_68[3] = BitAccessStream::getNext(data,iVar1);
      dVar8 = BitAccessStream::getNext(data,2);
      local_58 = BitAccessStream::getNext(data,iVar1);
      dVar9 = BitAccessStream::getNext(data,1);
      switch(uVar4) {
      case 1:
        dVar8 = 0;
        dVar9 = 0;
        dVar7 = 0;
        dVar6 = 0;
        break;
      case 2:
        dVar8 = 0;
        dVar9 = 0;
        dVar7 = 0;
        break;
      case 3:
        dVar8 = 0;
      case 4:
        dVar9 = 0;
      }
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      pdVar10 = &dst[(long)(uVar13 * 0x500000000) >> 0x20].v;
      for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
        dVar2 = local_68[uVar12];
        ((ISEDecodedResult *)(pdVar10 + -2))->m = dVar2;
        dVar3 = *(deUint32 *)
                 ((anonymous_namespace)::
                  decodeISETritBlock(tcu::astc::(anonymous_namespace)::ISEDecodedResult*,int,tcu::astc::(anonymous_namespace)::BitAccessStream&,int)
                  ::tritsFromT +
                 (ulong)(dVar8 << 5 | dVar5 | dVar7 << 4 | dVar9 << 7 | dVar6 << 2) * 0x14 +
                 uVar12 * 4);
        pdVar10[-1] = dVar3;
        *pdVar10 = (dVar3 << ((byte)iVar1 & 0x1f)) + dVar2;
        pdVar10 = pdVar10 + 3;
      }
    }
  }
  else if (params->mode == ISEMODE_QUINT) {
    uVar4 = (numValues / 3 + 1) - (uint)(numValues % 3 == 0);
    local_48 = (ulong)(uVar4 - 1);
    local_50 = CONCAT44(local_50._4_4_,(uVar4 - 1) * -3 + numValues);
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    for (uVar13 = 0; uVar13 != uVar4; uVar13 = uVar13 + 1) {
      uVar11 = 3;
      if (uVar13 == local_48) {
        uVar11 = (uint)local_50;
      }
      iVar1 = local_40->numBits;
      local_68[0] = BitAccessStream::getNext(data,iVar1);
      dVar5 = BitAccessStream::getNext(data,3);
      local_68[1] = BitAccessStream::getNext(data,iVar1);
      dVar6 = BitAccessStream::getNext(data,2);
      local_68[2] = BitAccessStream::getNext(data,iVar1);
      dVar7 = BitAccessStream::getNext(data,2);
      if (uVar11 == 2) {
        dVar7 = 0;
      }
      else if (uVar11 == 1) {
        dVar7 = 0;
        dVar6 = 0;
      }
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      pdVar10 = &dst[(long)(uVar13 * 0x300000000) >> 0x20].v;
      for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
        dVar8 = local_68[uVar12];
        ((ISEDecodedResult *)(pdVar10 + -2))->m = dVar8;
        dVar9 = *(deUint32 *)
                 ((anonymous_namespace)::
                  decodeISEQuintBlock(tcu::astc::(anonymous_namespace)::ISEDecodedResult*,int,tcu::astc::(anonymous_namespace)::BitAccessStream&,int)
                  ::quintsFromQ + (ulong)(dVar7 << 5 | dVar5 | dVar6 << 3) * 0xc + uVar12 * 4);
        pdVar10[-1] = dVar9;
        *pdVar10 = (dVar9 << ((byte)iVar1 & 0x1f)) + dVar8;
        pdVar10 = pdVar10 + 3;
      }
    }
  }
  else {
    uVar12 = 0;
    uVar13 = (ulong)(uint)numValues;
    if (numValues < 1) {
      uVar13 = uVar12;
    }
    for (; uVar13 * 0xc - uVar12 != 0; uVar12 = uVar12 + 0xc) {
      dVar5 = BitAccessStream::getNext(data,local_40->numBits);
      *(deUint32 *)((long)&dst->m + uVar12) = dVar5;
      *(deUint32 *)((long)&dst->v + uVar12) = dVar5;
    }
  }
  return;
}

Assistant:

void decodeISE (ISEDecodedResult* dst, int numValues, BitAccessStream& data, const ISEParams& params)
{
	if (params.mode == ISEMODE_TRIT)
	{
		const int numBlocks = deDivRoundUp32(numValues, 5);
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			const int numValuesInBlock = blockNdx == numBlocks-1 ? numValues - 5*(numBlocks-1) : 5;
			decodeISETritBlock(&dst[5*blockNdx], numValuesInBlock, data, params.numBits);
		}
	}
	else if (params.mode == ISEMODE_QUINT)
	{
		const int numBlocks = deDivRoundUp32(numValues, 3);
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			const int numValuesInBlock = blockNdx == numBlocks-1 ? numValues - 3*(numBlocks-1) : 3;
			decodeISEQuintBlock(&dst[3*blockNdx], numValuesInBlock, data, params.numBits);
		}
	}
	else
	{
		DE_ASSERT(params.mode == ISEMODE_PLAIN_BIT);
		for (int i = 0; i < numValues; i++)
			decodeISEBitBlock(&dst[i], data, params.numBits);
	}
}